

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O0

int Fl::test_shortcut(uint shortcut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *p;
  char *pcVar5;
  uint firstChar;
  uint key;
  int mismatch;
  int shift;
  uint v;
  uint shortcut_local;
  
  if (shortcut == 0) {
    v = 0;
  }
  else {
    uVar1 = fl_tolower(shortcut & 0xffff);
    shift = shortcut;
    if (uVar1 != (shortcut & 0xffff)) {
      shift = shortcut | 0x10000;
    }
    uVar1 = event_state();
    if ((shift & uVar1) == (shift & 0x7fff0000U)) {
      if (((shift ^ uVar1) & 0x4c0000) == 0) {
        uVar2 = shift & 0xffff;
        if ((((shift ^ uVar1) & 0x10000) == 0) && (uVar3 = event_key(), uVar2 == uVar3)) {
          return 1;
        }
        p = event_text();
        pcVar5 = event_text();
        iVar4 = event_length();
        uVar3 = fl_utf8decode(p,pcVar5 + iVar4,(wchar_t *)0x0);
        if (((uVar1 & 0x20000) == 0) && (uVar2 == uVar3)) {
          v = 1;
        }
        else if (((uVar1 & 0x40000) == 0) ||
                (((uVar2 < 0x3f || (0x5f < uVar2)) || (uVar3 != (uVar2 ^ 0x40))))) {
          v = 0;
        }
        else {
          v = 1;
        }
      }
      else {
        v = 0;
      }
    }
    else {
      v = 0;
    }
  }
  return v;
}

Assistant:

int Fl::test_shortcut(unsigned int shortcut) {
  if (!shortcut) return 0;

  unsigned int v = shortcut & FL_KEY_MASK;
  if (((unsigned)fl_tolower(v))!=v) {
    shortcut |= FL_SHIFT;
  }

  int shift = Fl::event_state();
  // see if any required shift flags are off:
  if ((shortcut&shift) != (shortcut&0x7fff0000)) return 0;
  // record shift flags that are wrong:
  int mismatch = (shortcut^shift)&0x7fff0000;
  // these three must always be correct:
  if (mismatch&(FL_META|FL_ALT|FL_CTRL)) return 0;

  unsigned int key = shortcut & FL_KEY_MASK;

  // if shift is also correct, check for exactly equal keysyms:
  if (!(mismatch&(FL_SHIFT)) && key == (unsigned)Fl::event_key()) return 1;

  // try matching utf8, ignore shift:
  unsigned int firstChar = fl_utf8decode(Fl::event_text(), Fl::event_text()+Fl::event_length(), 0);
  if ( ! (FL_CAPS_LOCK&shift) && key==firstChar) return 1;

  // kludge so that Ctrl+'_' works (as opposed to Ctrl+'^_'):
  if ((shift&FL_CTRL) && key >= 0x3f && key <= 0x5F
      && firstChar==(key^0x40)) return 1; // firstChar should be within a-z
  return 0;
}